

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  int *piVar1;
  ImDrawCmd *pIVar2;
  char cVar3;
  ushort uVar4;
  ImDrawIdx *pIVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  Glyph *pGVar11;
  ImDrawVert *__dest;
  unsigned_short *__dest_00;
  ImGuiContext *pIVar12;
  char *pcVar13;
  ImDrawIdx IVar14;
  uint uVar15;
  char *pcVar16;
  char *pcVar17;
  ImDrawVert *pIVar18;
  unsigned_short *puVar19;
  char *pcVar20;
  ImDrawVert *pIVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  uint c;
  char *local_d0;
  uint local_b4;
  ImDrawIdx *local_b0;
  ImU32 local_a4;
  int local_a0;
  int local_9c;
  float local_98;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  ulong local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar32 = pos.x;
  fVar25 = pos.y;
  local_98 = size;
  if (text_end == (char *)0x0) {
    fStack_80 = in_XMM1_Dc;
    local_88 = (undefined1  [8])pos;
    fStack_7c = in_XMM1_Dd;
    sVar9 = strlen(text_begin);
    text_end = text_begin + sVar9;
    fVar32 = (float)local_88._0_4_;
    fVar25 = (float)local_88._4_4_;
    in_XMM1_Dc = fStack_80;
    in_XMM1_Dd = fStack_7c;
  }
  local_68 = (this->DisplayOffset).x + (float)(int)fVar32;
  fStack_64 = (this->DisplayOffset).y + (float)(int)fVar25;
  fStack_60 = (float)(int)in_XMM1_Dc + 0.0;
  fStack_5c = (float)(int)in_XMM1_Dd + 0.0;
  if (clip_rect->w <= fStack_64 && fStack_64 != clip_rect->w) {
    return;
  }
  local_98 = local_98 / this->FontSize;
  fVar32 = this->FontSize * local_98;
  pcVar20 = text_begin;
  if ((wrap_width <= 0.0) && (text_begin < text_end && fStack_64 + fVar32 < clip_rect->y)) {
    do {
      pcVar20 = text_begin;
      if (*text_begin == '\n') break;
      text_begin = text_begin + 1;
      pcVar20 = text_end;
    } while (text_begin != text_end);
  }
  iVar7 = (int)text_end - (int)pcVar20;
  local_9c = iVar7 * 6;
  local_a0 = (draw_list->IdxBuffer).Size;
  local_a4 = col;
  ImDrawList::PrimReserve(draw_list,local_9c,iVar7 * 4);
  pIVar21 = draw_list->_VtxWritePtr;
  local_b0 = draw_list->_IdxWritePtr;
  if (pcVar20 < text_end) {
    local_70 = (ulong)draw_list->_VtxCurrentIdx;
    local_48 = local_98;
    fStack_44 = local_98;
    fStack_40 = local_98;
    fStack_3c = local_98;
    local_d0 = (char *)0x0;
    fVar25 = local_68;
    fVar24 = fStack_64;
    fVar26 = fStack_60;
    fVar28 = fStack_5c;
    fVar38 = local_68;
    fVar34 = fStack_64;
    fVar35 = fStack_60;
    fVar36 = fStack_5c;
    fVar39 = local_68;
    fVar40 = fStack_60;
    fVar41 = fStack_5c;
    fVar23 = local_68;
    fVar37 = fStack_64;
    fVar27 = fStack_60;
    fVar29 = fStack_5c;
    pcVar16 = pcVar20;
    pcVar13 = local_d0;
LAB_0014eef8:
    do {
      fStack_4c = fVar29;
      fStack_50 = fVar27;
      fStack_54 = fVar37;
      local_58 = fVar23;
      pcVar17 = pcVar16;
      fVar23 = fVar38;
      fVar37 = fVar34;
      fVar27 = fVar35;
      fVar29 = fVar36;
      pcVar6 = pcVar13;
      if (0.0 < wrap_width) {
        fVar23 = fVar25;
        fVar37 = fVar24;
        fVar27 = fVar26;
        fVar29 = fVar28;
        if (local_d0 == (char *)0x0) {
          local_88._4_4_ = fVar24;
          local_88._0_4_ = fVar25;
          fStack_80 = fVar26;
          fStack_7c = fVar28;
          local_d0 = CalcWordWrapPositionA
                               (this,local_98,pcVar20,text_end,(fVar39 - fVar25) + wrap_width);
          local_d0 = local_d0 + (local_d0 == pcVar20);
          fVar23 = (float)local_88._0_4_;
          fVar37 = (float)local_88._4_4_;
          fVar27 = fStack_80;
          fVar29 = fStack_7c;
          fVar38 = local_58;
          fVar34 = fStack_54;
          fVar35 = fStack_50;
          fVar36 = fStack_4c;
          fVar39 = local_68;
          fVar40 = fStack_60;
          fVar41 = fStack_5c;
        }
        pcVar17 = pcVar20;
        pcVar6 = local_d0;
        if (local_d0 <= pcVar20) {
          if (pcVar20 < text_end) {
            lVar10 = (long)text_end - (long)pcVar20;
            do {
              cVar3 = *pcVar20;
              if ((cVar3 != '\t') && (cVar3 != ' ')) {
                pcVar17 = pcVar20 + (cVar3 == '\n');
                break;
              }
              pcVar20 = pcVar20 + 1;
              lVar10 = lVar10 + -1;
              pcVar17 = text_end;
            } while (lVar10 != 0);
          }
          local_d0 = (char *)0x0;
          pcVar20 = pcVar17;
          fVar25 = fVar39;
          fVar24 = fVar37 + fVar32;
          fVar26 = fVar40;
          fVar28 = fVar41;
          fVar23 = local_58;
          fVar37 = fStack_54;
          fVar27 = fStack_50;
          fVar29 = fStack_4c;
          if (text_end <= pcVar17) break;
          goto LAB_0014eef8;
        }
      }
      local_d0 = pcVar6;
      local_b4 = (uint)*pcVar17;
      if (*pcVar17 < '\0') {
        local_58 = fVar23;
        fStack_54 = fVar37;
        fStack_50 = fVar27;
        fStack_4c = fVar29;
        uVar15 = ImTextCharFromUtf8(&local_b4,pcVar17,text_end);
        if (local_b4 == 0) break;
        pcVar17 = pcVar17 + uVar15;
        fVar23 = local_58;
        fVar24 = fStack_54;
        fVar27 = fStack_50;
        fVar29 = fStack_4c;
        fVar39 = local_68;
        fVar40 = fStack_60;
        fVar41 = fStack_5c;
      }
      else {
        pcVar17 = pcVar17 + 1;
        fVar24 = fVar37;
      }
      pcVar20 = pcVar17;
      fVar26 = fVar27;
      fVar28 = fVar29;
      if (local_b4 < 0x20) {
        fVar25 = fVar23;
        if (local_b4 != 0xd) {
          if (local_b4 != 10) goto LAB_0014f0b5;
          fVar24 = fVar24 + fVar32;
          if (clip_rect->w <= fVar24 && fVar24 != clip_rect->w) break;
          fVar25 = fVar39;
          fVar26 = fVar40;
          fVar28 = fVar41;
          if (((wrap_width <= 0.0) && (fVar24 + fVar32 < clip_rect->y)) && (pcVar17 < text_end)) {
            lVar10 = (long)text_end - (long)pcVar17;
            do {
              pcVar20 = pcVar17;
              if (*pcVar17 == '\n') break;
              pcVar17 = pcVar17 + 1;
              lVar10 = lVar10 + -1;
              pcVar20 = text_end;
            } while (lVar10 != 0);
          }
        }
      }
      else {
LAB_0014f0b5:
        if (((int)(local_b4 & 0xffff) < (this->IndexLookup).Size) &&
           (uVar4 = (this->IndexLookup).Data[local_b4 & 0xffff], uVar4 != 0xffff)) {
          pGVar11 = (Glyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar4 * 0x28))
          ;
        }
        else {
          pGVar11 = this->FallbackGlyph;
        }
        if (pGVar11 == (Glyph *)0x0) {
          fVar25 = 0.0;
        }
        else {
          fVar25 = pGVar11->XAdvance * local_98;
          if ((local_b4 != 9) && (local_b4 != 0x20)) {
            fVar34 = pGVar11->X0 * local_48 + fVar23;
            fVar35 = pGVar11->Y0 * fStack_44 + fVar24;
            fVar36 = pGVar11->X1 * fStack_40 + fVar23;
            fVar37 = pGVar11->Y1 * fStack_3c + fVar24;
            fVar38 = clip_rect->z;
            if ((fVar34 <= fVar38) && (fVar27 = clip_rect->x, fVar27 <= fVar36)) {
              fVar29 = pGVar11->U0;
              fVar33 = pGVar11->V0;
              fVar31 = pGVar11->U1;
              fVar30 = pGVar11->V1;
              if (cpu_fine_clip) {
                if (fVar34 < fVar27) {
                  fVar29 = fVar29 + (fVar31 - fVar29) *
                                    (1.0 - (fVar36 - fVar27) / (fVar36 - fVar34));
                  fVar34 = fVar27;
                }
                fVar27 = clip_rect->y;
                if (fVar35 < fVar27) {
                  local_88._0_4_ = fVar29;
                  fVar33 = fVar33 + (fVar30 - fVar33) *
                                    (1.0 - (fVar37 - fVar27) / (fVar37 - fVar35));
                  fVar35 = fVar27;
                }
                if (fVar38 < fVar36) {
                  fVar31 = (fVar31 - fVar29) * ((fVar38 - fVar34) / (fVar36 - fVar34)) + fVar29;
                  fVar36 = fVar38;
                }
                fVar38 = clip_rect->w;
                if (fVar38 < fVar37) {
                  fVar30 = (fVar30 - fVar33) * ((fVar38 - fVar35) / (fVar37 - fVar35)) + fVar33;
                  fVar37 = fVar38;
                }
                if (fVar37 <= fVar35) goto LAB_0014f1ac;
              }
              IVar14 = (ImDrawIdx)local_70;
              *local_b0 = IVar14;
              local_b0[1] = IVar14 + 1;
              local_b0[2] = IVar14 + 2;
              local_b0[3] = IVar14;
              local_b0[4] = IVar14 + 2;
              local_b0[5] = IVar14 + 3;
              (pIVar21->pos).x = fVar34;
              (pIVar21->pos).y = fVar35;
              pIVar21->col = local_a4;
              (pIVar21->uv).x = fVar29;
              (pIVar21->uv).y = fVar33;
              pIVar21[1].pos.x = fVar36;
              pIVar21[1].pos.y = fVar35;
              pIVar21[1].col = local_a4;
              pIVar21[1].uv.x = fVar31;
              pIVar21[1].uv.y = fVar33;
              pIVar21[2].pos.x = fVar36;
              pIVar21[2].pos.y = fVar37;
              pIVar21[2].col = local_a4;
              pIVar21[2].uv.x = fVar31;
              pIVar21[2].uv.y = fVar30;
              pIVar21[3].pos.x = fVar34;
              pIVar21[3].pos.y = fVar37;
              pIVar21[3].col = local_a4;
              pIVar21[3].uv.x = fVar29;
              pIVar21[3].uv.y = fVar30;
              pIVar21 = pIVar21 + 4;
              local_70 = (ulong)((int)local_70 + 4);
              local_b0 = local_b0 + 6;
            }
            fVar25 = fVar23 + fVar25;
            goto LAB_0014f1b6;
          }
        }
LAB_0014f1ac:
        fVar25 = fVar23 + fVar25;
      }
LAB_0014f1b6:
      fVar38 = fVar25;
      fVar34 = fVar24;
      fVar35 = fVar26;
      fVar36 = fVar28;
      fVar23 = fVar25;
      fVar37 = fVar24;
      fVar27 = fVar26;
      fVar29 = fVar28;
      pcVar16 = pcVar20;
      pcVar13 = local_d0;
    } while (pcVar20 < text_end);
  }
  pIVar5 = local_b0;
  pIVar12 = GImGui;
  iVar8 = (int)((ulong)((long)pIVar21 - (long)(draw_list->VtxBuffer).Data) >> 2);
  uVar15 = iVar8 * -0x33333333;
  iVar7 = (draw_list->VtxBuffer).Capacity;
  if (SBORROW4(iVar7,uVar15) != iVar7 + iVar8 * 0x33333333 < 0) {
    if (iVar7 == 0) {
      uVar22 = 8;
    }
    else {
      uVar22 = iVar7 / 2 + iVar7;
    }
    if ((int)uVar22 <= (int)uVar15) {
      uVar22 = uVar15;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest = (ImDrawVert *)(*(pIVar12->IO).MemAllocFn)((long)(int)uVar22 * 0x14);
    pIVar18 = (draw_list->VtxBuffer).Data;
    if (pIVar18 == (ImDrawVert *)0x0) {
LAB_0014f431:
      pIVar18 = (ImDrawVert *)0x0;
      pIVar12 = GImGui;
    }
    else {
      memcpy(__dest,pIVar18,(long)(draw_list->VtxBuffer).Size * 0x14);
      pIVar12 = GImGui;
      pIVar18 = (draw_list->VtxBuffer).Data;
      if (pIVar18 == (ImDrawVert *)0x0) goto LAB_0014f431;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar12->IO).MemFreeFn)(pIVar18);
    (draw_list->VtxBuffer).Data = __dest;
    (draw_list->VtxBuffer).Capacity = uVar22;
  }
  (draw_list->VtxBuffer).Size = uVar15;
  pIVar12 = GImGui;
  iVar7 = (draw_list->IdxBuffer).Capacity;
  iVar8 = (int)((ulong)((long)pIVar5 - (long)(draw_list->IdxBuffer).Data) >> 1);
  if (iVar8 <= iVar7) goto LAB_0014f4dc;
  if (iVar7 == 0) {
    iVar7 = 8;
  }
  else {
    iVar7 = iVar7 / 2 + iVar7;
  }
  if (iVar7 <= iVar8) {
    iVar7 = iVar8;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest_00 = (unsigned_short *)(*(pIVar12->IO).MemAllocFn)((long)iVar7 * 2);
  puVar19 = (draw_list->IdxBuffer).Data;
  if (puVar19 == (unsigned_short *)0x0) {
LAB_0014f4ca:
    puVar19 = (unsigned_short *)0x0;
    pIVar12 = GImGui;
  }
  else {
    memcpy(__dest_00,puVar19,(long)(draw_list->IdxBuffer).Size * 2);
    pIVar12 = GImGui;
    puVar19 = (draw_list->IdxBuffer).Data;
    if (puVar19 == (unsigned_short *)0x0) goto LAB_0014f4ca;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar12->IO).MemFreeFn)(puVar19);
  (draw_list->IdxBuffer).Data = __dest_00;
  (draw_list->IdxBuffer).Capacity = iVar7;
  uVar15 = (draw_list->VtxBuffer).Size;
LAB_0014f4dc:
  (draw_list->IdxBuffer).Size = iVar8;
  pIVar2 = (draw_list->CmdBuffer).Data + (long)(draw_list->CmdBuffer).Size + -1;
  pIVar2->ElemCount = pIVar2->ElemCount + (iVar8 - (local_9c + local_a0));
  draw_list->_VtxWritePtr = pIVar21;
  draw_list->_IdxWritePtr = pIVar5;
  draw_list->_VtxCurrentIdx = uVar15;
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin);

    // Align to be pixel perfect
    pos.x = (float)(int)pos.x + DisplayOffset.x;
    pos.y = (float)(int)pos.y + DisplayOffset.y;
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Skip non-visible lines
    const char* s = text_begin;
    if (!word_wrap_enabled && y + line_height < clip_rect.y)
        while (s < text_end && *s != '\n')  // Fast-forward to next line
            s++;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsSpace(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0)
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;

                if (y > clip_rect.w)
                    break;
                if (!word_wrap_enabled && y + line_height < clip_rect.y)
                    while (s < text_end && *s != '\n')  // Fast-forward to next line
                        s++;
                continue;
            }
            if (c == '\r')
                continue;
        }

        float char_width = 0.0f;
        if (const Glyph* glyph = FindGlyph((unsigned short)c))
        {
            char_width = glyph->XAdvance * scale;

            // Arbitrarily assume that both space and tabs are empty glyphs as an optimization
            if (c != ' ' && c != '\t')
            {
                // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
                float x1 = x + glyph->X0 * scale;
                float x2 = x + glyph->X1 * scale;
                float y1 = y + glyph->Y0 * scale;
                float y2 = y + glyph->Y1 * scale;
                if (x1 <= clip_rect.z && x2 >= clip_rect.x)
                {
                    // Render a character
                    float u1 = glyph->U0;
                    float v1 = glyph->V0;
                    float u2 = glyph->U1;
                    float v2 = glyph->V1;

                    // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                    if (cpu_fine_clip)
                    {
                        if (x1 < clip_rect.x)
                        {
                            u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                            x1 = clip_rect.x;
                        }
                        if (y1 < clip_rect.y)
                        {
                            v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                            y1 = clip_rect.y;
                        }
                        if (x2 > clip_rect.z)
                        {
                            u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                            x2 = clip_rect.z;
                        }
                        if (y2 > clip_rect.w)
                        {
                            v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                            y2 = clip_rect.w;
                        }
                        if (y1 >= y2)
                        {
                            x += char_width;
                            continue;
                        }
                    }

                    // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug build.
                    // Inlined here:
                    {
                        idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                        idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                        vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                        vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                        vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                        vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                        vtx_write += 4;
                        vtx_current_idx += 4;
                        idx_write += 6;
                    }
                }
            }
        }

        x += char_width;
    }

    // Give back unused vertices
    draw_list->VtxBuffer.resize((int)(vtx_write - draw_list->VtxBuffer.Data));
    draw_list->IdxBuffer.resize((int)(idx_write - draw_list->IdxBuffer.Data));
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = (unsigned int)draw_list->VtxBuffer.Size;
}